

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

string * __thiscall
spectest::ExpectedValueToString_abi_cxx11_
          (string *__return_storage_ptr__,spectest *this,ExpectedValue *ev)

{
  ExpectedNan EVar1;
  Enum EVar2;
  char *pcVar3;
  TypedValue *tv;
  ExpectedValue *ev_00;
  ExpectedValue local_80;
  string local_48;
  int local_28;
  allocator local_22;
  undefined1 local_21;
  int lane;
  int local_1c;
  ExpectedValue *pEStack_18;
  int lane_count;
  ExpectedValue *ev_local;
  string *result;
  
  pEStack_18 = (ExpectedValue *)this;
  ev_local = (ExpectedValue *)__return_storage_ptr__;
  EVar2 = wabt::Type::operator_cast_to_Enum((Type *)this);
  if (EVar2 == V128) {
    lane = (pEStack_18->lane_type).enum_;
    local_1c = LaneCountFromType((Type)lane);
    local_21 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"v128 ",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    for (local_28 = 0; local_28 < local_1c; local_28 = local_28 + 1) {
      GetLane(&local_80,pEStack_18,local_28);
      ExpectedValueToString_abi_cxx11_(&local_48,(spectest *)&local_80,ev_00);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    return __return_storage_ptr__;
  }
  if (EVar2 == F64 || EVar2 == F32) {
    EVar1 = pEStack_18->nan[0];
    if (EVar1 == None) {
      wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)pEStack_18,tv);
      return __return_storage_ptr__;
    }
    if (EVar1 == Canonical) {
      pcVar3 = wabt::Type::GetName((Type *)pEStack_18);
      wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:nan:canonical",pcVar3);
      return __return_storage_ptr__;
    }
    if (EVar1 == Arithmetic) {
      pcVar3 = wabt::Type::GetName((Type *)pEStack_18);
      wabt::StringPrintf_abi_cxx11_(__return_storage_ptr__,"%s:nan:arithmetic",pcVar3);
      return __return_storage_ptr__;
    }
  }
  wabt::interp::TypedValueToString_abi_cxx11_(__return_storage_ptr__,(interp *)pEStack_18,tv);
  return __return_storage_ptr__;
}

Assistant:

static std::string ExpectedValueToString(const ExpectedValue& ev) {
  // Extend TypedValueToString to print expected nan values too.
  switch (ev.value.type) {
    case Type::F32:
    case Type::F64:
      switch (ev.nan[0]) {
        case ExpectedNan::None:
          return TypedValueToString(ev.value);

        case ExpectedNan::Arithmetic:
          return StringPrintf("%s:nan:arithmetic", ev.value.type.GetName());

        case ExpectedNan::Canonical:
          return StringPrintf("%s:nan:canonical", ev.value.type.GetName());
      }
      break;

    case Type::V128: {
      int lane_count = LaneCountFromType(ev.lane_type);
      std::string result = "v128 ";
      for (int lane = 0; lane < lane_count; ++lane) {
        result += ExpectedValueToString(GetLane(ev, lane));
      }
      return result;
    }

    default:
      break;
  }
  return TypedValueToString(ev.value);
}